

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::addMeshNVDecoration
          (TGlslangToSpvTraverser *this,Id id,int member,TQualifier *qualifier)

{
  bool bVar1;
  EShLanguage EVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  _Self local_60;
  allocator<char> local_51;
  key_type local_50;
  _Self local_30;
  byte local_21;
  TQualifier *pTStack_20;
  bool isMeshShaderExt;
  TQualifier *qualifier_local;
  int member_local;
  Id id_local;
  TGlslangToSpvTraverser *this_local;
  
  pTStack_20 = qualifier;
  qualifier_local._0_4_ = member;
  qualifier_local._4_4_ = id;
  _member_local = this;
  psVar3 = glslang::TIntermediate::getRequestedExtensions_abi_cxx11_(this->glslangIntermediate);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"GL_EXT_mesh_shader",&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(psVar3,&local_50);
  psVar3 = glslang::TIntermediate::getRequestedExtensions_abi_cxx11_(this->glslangIntermediate);
  local_60._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(psVar3);
  bVar1 = std::operator!=(&local_30,&local_60);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_21 = bVar1;
  if ((int)(uint)qualifier_local < 0) {
    if ((*(ulong *)&pTStack_20->field_0x8 >> 0x29 & 1) != 0) {
      EVar2 = glslang::TIntermediate::getStage(this->glslangIntermediate);
      if (EVar2 == EShLangFragment) {
        if ((local_21 & 1) == 0) {
          spv::Builder::addCapability(&this->builder,CapabilityMeshShadingNV);
          spv::Builder::addExtension(&this->builder,"SPV_NV_mesh_shader");
        }
        else {
          spv::Builder::addCapability(&this->builder,CapabilityMeshShadingEXT);
          spv::Builder::addExtension(&this->builder,"SPV_EXT_mesh_shader");
        }
      }
      spv::Builder::addDecoration(&this->builder,qualifier_local._4_4_,DecorationPerPrimitiveEXT,-1)
      ;
    }
    if ((*(ulong *)&pTStack_20->field_0x8 >> 0x2a & 1) != 0) {
      spv::Builder::addDecoration(&this->builder,qualifier_local._4_4_,DecorationPerViewNV,-1);
    }
    if ((*(ulong *)&pTStack_20->field_0x8 >> 0x2b & 1) != 0) {
      spv::Builder::addDecoration(&this->builder,qualifier_local._4_4_,DecorationPerTaskNV,-1);
    }
  }
  else {
    if ((*(ulong *)&pTStack_20->field_0x8 >> 0x29 & 1) != 0) {
      EVar2 = glslang::TIntermediate::getStage(this->glslangIntermediate);
      if (EVar2 == EShLangFragment) {
        if ((local_21 & 1) == 0) {
          spv::Builder::addCapability(&this->builder,CapabilityMeshShadingNV);
          spv::Builder::addExtension(&this->builder,"SPV_NV_mesh_shader");
        }
        else {
          spv::Builder::addCapability(&this->builder,CapabilityMeshShadingEXT);
          spv::Builder::addExtension(&this->builder,"SPV_EXT_mesh_shader");
        }
      }
      spv::Builder::addMemberDecoration
                (&this->builder,qualifier_local._4_4_,(uint)qualifier_local,
                 DecorationPerPrimitiveEXT,-1);
    }
    if ((*(ulong *)&pTStack_20->field_0x8 >> 0x2a & 1) != 0) {
      spv::Builder::addMemberDecoration
                (&this->builder,qualifier_local._4_4_,(uint)qualifier_local,DecorationPerViewNV,-1);
    }
    if ((*(ulong *)&pTStack_20->field_0x8 >> 0x2b & 1) != 0) {
      spv::Builder::addMemberDecoration
                (&this->builder,qualifier_local._4_4_,(uint)qualifier_local,DecorationPerTaskNV,-1);
    }
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::addMeshNVDecoration(spv::Id id, int member, const glslang::TQualifier& qualifier)
{
    bool isMeshShaderExt = (glslangIntermediate->getRequestedExtensions().find(glslang::E_GL_EXT_mesh_shader) !=
                            glslangIntermediate->getRequestedExtensions().end());

    if (member >= 0) {
        if (qualifier.perPrimitiveNV) {
            // Need to add capability/extension for fragment shader.
            // Mesh shader already adds this by default.
            if (glslangIntermediate->getStage() == EShLangFragment) {
                if(isMeshShaderExt) {
                    builder.addCapability(spv::CapabilityMeshShadingEXT);
                    builder.addExtension(spv::E_SPV_EXT_mesh_shader);
                } else {
                    builder.addCapability(spv::CapabilityMeshShadingNV);
                    builder.addExtension(spv::E_SPV_NV_mesh_shader);
                }
            }
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerPrimitiveNV);
        }
        if (qualifier.perViewNV)
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerViewNV);
        if (qualifier.perTaskNV)
            builder.addMemberDecoration(id, (unsigned)member, spv::DecorationPerTaskNV);
    } else {
        if (qualifier.perPrimitiveNV) {
            // Need to add capability/extension for fragment shader.
            // Mesh shader already adds this by default.
            if (glslangIntermediate->getStage() == EShLangFragment) {
                if(isMeshShaderExt) {
                    builder.addCapability(spv::CapabilityMeshShadingEXT);
                    builder.addExtension(spv::E_SPV_EXT_mesh_shader);
                } else {
                    builder.addCapability(spv::CapabilityMeshShadingNV);
                    builder.addExtension(spv::E_SPV_NV_mesh_shader);
                }
            }
            builder.addDecoration(id, spv::DecorationPerPrimitiveNV);
        }
        if (qualifier.perViewNV)
            builder.addDecoration(id, spv::DecorationPerViewNV);
        if (qualifier.perTaskNV)
            builder.addDecoration(id, spv::DecorationPerTaskNV);
    }
}